

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.h
# Opt level: O0

NLSolution * __thiscall
mp::NLSolver::Solve(NLSolver *this,NLModel *mdl,string *solver,string *solver_opts)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  string *in_RDX;
  string *in_RSI;
  NLSolver *in_RDI;
  double dVar4;
  NLSolver *in_stack_000000d8;
  NLSolution *sol;
  NLModel *in_stack_00000218;
  NLSolver *in_stack_00000220;
  NLSolution *in_stack_fffffffffffffef8;
  NLSolution *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff28;
  NLModel *in_stack_ffffffffffffff30;
  NLSolver *this_00;
  
  this_00 = in_RDI;
  NLSolution::NLSolution(in_stack_ffffffffffffff00);
  uVar1 = LoadModel(in_stack_00000220,in_stack_00000218);
  if (((bool)uVar1) && (bVar2 = Solve(this_00,in_RSI,in_RDX), bVar2)) {
    ReadSolution(in_stack_000000d8);
    NLSolution::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    NLSolution::~NLSolution(in_stack_ffffffffffffff00);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)((long)&in_RDI->pathstr_ + 0x18));
    if (sVar3 != 0) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x106190);
      dVar4 = NLModel::ComputeObjValue
                        (in_stack_ffffffffffffff30,
                         (double *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        *)&in_RDI->pathstr_)[1]._M_allocated_capacity = (size_type)dVar4;
    }
  }
  return (NLSolution *)in_RDI;
}

Assistant:

NLSolution Solve(const NLModel& mdl,
                   const std::string& solver,
                   const std::string& solver_opts) {
    NLSolution sol;
    if (LoadModel(mdl)
        && Solve(solver, solver_opts)) {
      sol = ReadSolution();
      if (sol.x_.size())
        sol.obj_val_ = mdl.ComputeObjValue(sol.x_.data());
    }
    return sol;
  }